

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void __kmp_api_omp_set_nest_lock(void **user_lock)

{
  kmp_info_t *pkVar1;
  uint gtid;
  void *unaff_retaddr;
  
  gtid = __kmp_get_global_thread_id_reg();
  if ((((-1 < (int)gtid & ompt_enabled._0_1_) == 1) &&
      (pkVar1 = __kmp_threads[gtid], pkVar1 != (kmp_info_t *)0x0)) &&
     ((pkVar1->th).ompt_thread_info.return_address == (void *)0x0)) {
    (pkVar1->th).ompt_thread_info.return_address = unaff_retaddr;
  }
  __kmpc_set_nest_lock((ident_t *)0x0,gtid,user_lock);
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_NEST_LOCK)(void **user_lock) {
#ifdef KMP_STUB
  if (*((kmp_stub_lock_t *)user_lock) == UNINIT) {
    // TODO: Issue an error.
  }
  (*((int *)user_lock))++;
#else
  int gtid = __kmp_entry_gtid();
#if OMPT_SUPPORT && OMPT_OPTIONAL
  OMPT_STORE_RETURN_ADDRESS(gtid);
#endif
  __kmpc_set_nest_lock(NULL, gtid, user_lock);
#endif
}